

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void indexesFromRange<QList<QModelIndex>>(QItemSelectionRange *range,QList<QModelIndex> *result)

{
  bool bVar1;
  int arow;
  int acolumn;
  int iVar2;
  int iVar3;
  QFlagsStorage<Qt::ItemFlag> flags;
  QAbstractItemModel *pQVar4;
  QModelIndex *in_RSI;
  QItemSelectionRange *in_RDI;
  long in_FS_OFFSET;
  int column;
  int row;
  int right;
  int bottom;
  QModelIndex index;
  QModelIndex columnLeader;
  QModelIndex topLeft;
  int iVar5;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QItemSelectionRange::isValid(in_RDI);
  if ((bVar1) &&
     (pQVar4 = QItemSelectionRange::model((QItemSelectionRange *)0x824b69),
     pQVar4 != (QAbstractItemModel *)0x0)) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelectionRange::topLeft(in_RDI);
    QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)in_RSI);
    arow = QItemSelectionRange::bottom((QItemSelectionRange *)0x824bb8);
    acolumn = QItemSelectionRange::right((QItemSelectionRange *)0x824bc6);
    iVar2 = QModelIndex::row((QModelIndex *)&local_20);
    while (iVar2 <= arow) {
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      iVar5 = iVar2;
      QModelIndex::column((QModelIndex *)&local_20);
      QModelIndex::sibling(in_RSI,arow,acolumn);
      for (iVar3 = QModelIndex::column((QModelIndex *)&local_20); iVar3 <= acolumn;
          iVar3 = iVar3 + 1) {
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        QModelIndex::sibling(in_RSI,arow,acolumn);
        pQVar4 = QItemSelectionRange::model((QItemSelectionRange *)0x824c90);
        flags.i = (*(pQVar4->super_QObject)._vptr_QObject[0x27])(pQVar4,&local_50);
        bVar1 = isSelectableAndEnabled((ItemFlags)flags.i);
        if (bVar1) {
          QList<QModelIndex>::push_back
                    ((QList<QModelIndex> *)CONCAT44(iVar5,iVar3),
                     (parameter_type)CONCAT44(flags.i,iVar2));
        }
      }
      iVar2 = iVar5 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void indexesFromRange(const QItemSelectionRange &range, ModelIndexContainer &result)
{
    if (range.isValid() && range.model()) {
        const QModelIndex topLeft = range.topLeft();
        const int bottom = range.bottom();
        const int right = range.right();
        for (int row = topLeft.row(); row <= bottom; ++row) {
            const QModelIndex columnLeader = topLeft.sibling(row, topLeft.column());
            for (int column = topLeft.column(); column <= right; ++column) {
                QModelIndex index = columnLeader.sibling(row, column);
                if (isSelectableAndEnabled(range.model()->flags(index)))
                    result.push_back(index);
            }
        }
    }
}